

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionKalman4.cpp
# Opt level: O2

void __thiscall RTFusionKalman4::update(RTFusionKalman4 *this)

{
  RTMatrix4x4 *this_00;
  RTMatrix4x4 *this_01;
  RTMatrix4x4 *this_02;
  char *pcVar1;
  RTQuaternion delta;
  RTMatrix4x4 SkInverse;
  RTMatrix4x4 Sk;
  RTQuaternion RStack_f8;
  RTMatrix4x4 local_e8;
  RTMatrix4x4 local_a8;
  RTMatrix4x4 local_68;
  
  RTQuaternion::RTQuaternion(&RStack_f8);
  RTMatrix4x4::RTMatrix4x4(&local_68);
  RTMatrix4x4::RTMatrix4x4(&local_a8);
  if (((this->super_RTFusion).m_enableCompass == false) &&
     ((this->super_RTFusion).m_enableAccel != true)) {
    RTQuaternion::RTQuaternion((RTQuaternion *)&local_e8);
  }
  else {
    local_e8.m_data[0] =
         (RTFLOAT  [4])
         RTQuaternion::operator-(&(this->super_RTFusion).m_measuredQPose,&this->m_stateQ);
  }
  RTQuaternion::operator=(&this->m_stateQError,(RTQuaternion *)&local_e8);
  this_00 = &this->m_Pkk_1;
  RTMatrix4x4::operator+(&local_e8,this_00,&this->m_Rk);
  RTMatrix4x4::operator=(&local_68,&local_e8);
  RTMatrix4x4::inverted(&local_e8,&local_68);
  RTMatrix4x4::operator=(&local_a8,&local_e8);
  RTMatrix4x4::operator*(&local_e8,this_00,&local_a8);
  this_01 = &this->m_Kk;
  RTMatrix4x4::operator=(this_01,&local_e8);
  if ((this->super_RTFusion).m_debug == true) {
    pcVar1 = RTMath::display("Gain",this_01);
    printf("%s",pcVar1);
    fflush(_stdout);
  }
  local_e8.m_data[0] = (RTFLOAT  [4])RTMatrix4x4::operator*(this_01,&this->m_stateQError);
  RTQuaternion::operator=(&RStack_f8,(RTQuaternion *)&local_e8);
  RTQuaternion::operator+=(&this->m_stateQ,&RStack_f8);
  RTQuaternion::normalize(&this->m_stateQ);
  this_02 = &this->m_Pkk;
  RTMatrix4x4::setToIdentity(this_02);
  RTMatrix4x4::operator-=(this_02,this_01);
  RTMatrix4x4::operator*(&local_e8,this_02,this_00);
  RTMatrix4x4::operator=(this_02,&local_e8);
  if ((this->super_RTFusion).m_debug == true) {
    pcVar1 = RTMath::display("Cov",this_02);
    printf("%s",pcVar1);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RTFusionKalman4::update()
{
    RTQuaternion delta;
    RTMatrix4x4 Sk, SkInverse;

    if (m_enableCompass || m_enableAccel) {
        m_stateQError = m_measuredQPose - m_stateQ;
    } else {
        m_stateQError = RTQuaternion();
    }

    //	Compute residual covariance Sk = Hk * Pkk_1 * HkTranspose + Rk
    //  Note: since Hk is the identity matrix, this has been simplified

    Sk = m_Pkk_1 + m_Rk;

    //	Compute Kalman gain Kk = Pkk_1 * HkTranspose * SkInverse
    //  Note: again, the HkTranspose part is omitted

    SkInverse = Sk.inverted();

    m_Kk = m_Pkk_1 * SkInverse;

    if (m_debug)
        HAL_INFO(RTMath::display("Gain", m_Kk));

    // make new state estimate

    delta = m_Kk * m_stateQError;

    m_stateQ += delta;

    m_stateQ.normalize();

    //  produce new estimate covariance Pkk = (I - Kk * Hk) * Pkk_1
    //  Note: since Hk is the identity matrix, it is omitted

    m_Pkk.setToIdentity();
    m_Pkk -= m_Kk;
    m_Pkk = m_Pkk * m_Pkk_1;

    if (m_debug)
        HAL_INFO(RTMath::display("Cov", m_Pkk));
}